

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar2 = pX->nLTerm;
  uVar3 = pX->nSkip;
  uVar4 = pY->nSkip;
  if ((int)((uint)uVar2 - (uint)uVar3) < (int)((uint)pY->nLTerm - (uint)uVar4)) {
    if (pY->rRun < pX->rRun) {
      if ((uVar4 <= uVar3) && (pX->nOut <= pY->nOut)) {
LAB_001a60d3:
        if ((ulong)uVar2 != 0) {
          uVar7 = (ulong)uVar2;
          do {
            uVar9 = (ulong)pY->nLTerm;
            if (pX->aLTerm[uVar7 - 1] != (WhereTerm *)0x0) {
              do {
                if ((long)uVar9 < 1) {
                  iVar8 = 0;
                  goto LAB_001a610b;
                }
                uVar1 = uVar9 - 1;
                lVar6 = uVar9 - 1;
                uVar9 = uVar1;
              } while (pY->aLTerm[lVar6] != pX->aLTerm[uVar7 - 1]);
              iVar8 = (int)uVar1 + 1;
LAB_001a610b:
              if (iVar8 < 1) {
                return 0;
              }
            }
            bVar5 = 1 < (long)uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar5);
        }
        if (((pX->wsFlags & 0x40) == 0) || (iVar8 = 0, (pY->wsFlags & 0x40) != 0)) {
          iVar8 = 1;
        }
        return iVar8;
      }
    }
    else if (uVar4 <= uVar3) goto LAB_001a60d3;
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0;
  if( pY->nSkip > pX->nSkip ) return 0;
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}